

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_C101_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_C101_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  const_reference pvVar2;
  key_type kVar3;
  char *pcVar4;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  key_view akey_02;
  key_view akey_03;
  key_view akey_04;
  key_view akey_05;
  key_view akey_06;
  undefined8 in_stack_ffffffffffffe4d0;
  undefined7 in_stack_ffffffffffffe4d8;
  undefined1 in_stack_ffffffffffffe4df;
  string local_1ad0;
  AssertHelper local_1ab0;
  Message local_1aa8;
  bool local_1a99;
  undefined1 local_1a98 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1a68;
  Message local_1a60 [2];
  value_view local_1a50;
  bool local_1a39;
  undefined1 local_1a38 [8];
  AssertionResult gtest_ar__26;
  Message local_1a20;
  key_view local_1a18;
  uint64_t local_1a08;
  undefined1 local_1a00 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_19d0;
  Message local_19c8;
  bool local_19b9;
  undefined1 local_19b8 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_1988;
  Message local_1980;
  bool local_1971;
  undefined1 local_1970 [8];
  AssertionResult gtest_ar__24;
  undefined1 local_1958 [8];
  iterator it_9;
  undefined1 local_17e0 [7];
  bool match_9;
  AssertHelper local_17c0;
  Message local_17b8;
  bool local_17a9;
  undefined1 local_17a8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_1778;
  Message local_1770;
  bool local_1761;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar__22;
  undefined1 local_1748 [8];
  iterator it_8;
  undefined1 local_15d0 [7];
  bool match_8;
  AssertHelper local_15b0;
  Message local_15a8;
  bool local_1599;
  undefined1 local_1598 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_1568;
  Message local_1560;
  bool local_1551;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar__20;
  undefined1 local_1538 [8];
  iterator it_7;
  undefined1 local_13c0 [7];
  bool match_7;
  AssertHelper local_13a0;
  Message local_1398 [2];
  value_view local_1388;
  bool local_1371;
  undefined1 local_1370 [8];
  AssertionResult gtest_ar__19;
  Message local_1358;
  key_view local_1350;
  uint64_t local_1340;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar_7;
  Message local_1320;
  bool local_1311;
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_12e0;
  Message local_12d8;
  bool local_12c9;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar__18;
  undefined1 local_12b0 [8];
  iterator it_6;
  undefined1 local_1138 [7];
  bool match_6;
  AssertHelper local_1118;
  Message local_1110 [2];
  value_view local_1100;
  bool local_10e9;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar__17;
  Message local_10d0;
  key_view local_10c8;
  uint64_t local_10b8;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_1080;
  Message local_1078;
  undefined1 local_1070 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_1040;
  Message local_1038;
  bool local_1029;
  undefined1 local_1028 [8];
  AssertionResult gtest_ar__15;
  undefined1 local_1010 [8];
  iterator it_5;
  undefined1 local_e98 [7];
  bool match_5;
  AssertHelper local_e78;
  Message local_e70 [2];
  value_view local_e60;
  bool local_e49;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar__14;
  Message local_e30;
  key_view local_e28;
  uint64_t local_e18;
  undefined1 local_e10 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_de0;
  Message local_dd8;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_da0;
  Message local_d98;
  bool local_d89;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_d70 [8];
  iterator it_4;
  undefined1 local_bf8 [7];
  bool match_4;
  AssertHelper local_bd8;
  Message local_bd0 [2];
  value_view local_bc0;
  bool local_ba9;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar__11;
  Message local_b90;
  key_view local_b88;
  uint64_t local_b78;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_b40;
  Message local_b38;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_b00;
  Message local_af8;
  bool local_ae9;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar__9;
  undefined1 local_ad0 [8];
  iterator it_3;
  undefined1 local_958 [7];
  bool match_3;
  AssertHelper local_938;
  Message local_930 [2];
  value_view local_920;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__8;
  Message local_8f0;
  key_view local_8e8;
  uint64_t local_8d8;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_8a0;
  Message local_898;
  undefined1 local_890 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_860;
  Message local_858;
  bool local_849;
  undefined1 local_848 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_830 [8];
  iterator it_2;
  undefined1 local_6b8 [7];
  bool match_2;
  AssertHelper local_698;
  Message local_690 [2];
  value_view local_680;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__5;
  Message local_650;
  key_view local_648;
  uint64_t local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_600;
  Message local_5f8;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_5c0;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_590 [8];
  iterator it_1;
  undefined1 local_418 [7];
  bool match_1;
  AssertHelper local_3f8;
  Message local_3f0 [2];
  value_view local_3e0;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__2;
  Message local_3b0;
  key_view local_3a8;
  uint64_t local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar;
  AssertHelper local_360;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_;
  bool local_2e9;
  undefined1 local_2e8 [7];
  bool match;
  iterator it;
  unsigned_long local_130;
  uint64_t k2;
  uint64_t k1;
  uint64_t k0;
  TypeParam *db;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_C101_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe4df,in_stack_ffffffffffffe4d8),
                  SUB81((ulong)in_stack_ffffffffffffe4d0 >> 0x38,0));
  k0 = (uint64_t)
       unodb::test::
       tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
       ::get_db((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)&db);
  k1 = 0xaa00;
  k2 = 0xaa10;
  local_130 = 0xab10;
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xaa00,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xaa10,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  it.keybuf_.off = (size_t)pvVar2->_M_ptr;
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xab10,v_01,false);
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_2e8,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  local_2e9 = false;
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa00);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar_.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_2e8,
             (art_key_type)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_2e9,true);
  local_309 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_2e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_308,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x19c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_350,&local_2e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_350,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x19d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3a8 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_2e8);
  akey._M_extent = local_3a8._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_398 = decode((anon_unknown_dwarf_d5c8 *)local_3a8._M_ptr,akey);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_390,"(decode(it.get_key()))","(k0)",&local_398,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x19e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3e0 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_2e8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_3c9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_3e0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_418,(internal *)local_3c8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1a0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3f8,local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)local_418);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_2e8);
  it_1.keybuf_.off._7_1_ = 0;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_590,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__3.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_590,
             (art_key_type)
             gtest_ar__3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_1.keybuf_.off + 7),true);
  local_5a9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_590);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5a8,&local_5a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_5a8,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1a7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,(bool *)((long)&it_1.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_5f0,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1a8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  local_648 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_590);
  akey_00._M_extent = local_648._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_638 = decode((anon_unknown_dwarf_d5c8 *)local_648._M_ptr,akey_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_630,"(decode(it.get_key()))","(k1)",&local_638,&k2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1a9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_680 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_590);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_669 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_680,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_668,&local_669,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(local_690);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_6b8,(internal *)local_668,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1ab,pcVar4);
    testing::internal::AssertHelper::operator=(&local_698,local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    std::__cxx11::string::~string((string *)local_6b8);
    testing::Message::~Message(local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_590);
  it_2.keybuf_.off._7_1_ = 0;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_830,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xab10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__6.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_830,
             (art_key_type)
             gtest_ar__6.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_2.keybuf_.off + 7),true);
  local_849 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_830);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_848,&local_849,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar1) {
    testing::Message::Message(&local_858);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_848,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1b2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_860,&local_858);
    testing::internal::AssertHelper::~AssertHelper(&local_860);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_890,(bool *)((long)&it_2.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_890,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1b3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  local_8e8 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_830);
  akey_01._M_extent = local_8e8._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_8d8 = decode((anon_unknown_dwarf_d5c8 *)local_8e8._M_ptr,akey_01);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_8d0,"(decode(it.get_key()))","(k2)",&local_8d8,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1b4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  local_920 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_830);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_909 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_920,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(local_930);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_958,(internal *)local_908,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_958);
    testing::internal::AssertHelper::AssertHelper
              (&local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1b6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_938,local_930);
    testing::internal::AssertHelper::~AssertHelper(&local_938);
    std::__cxx11::string::~string((string *)local_958);
    testing::Message::~Message(local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_830);
  it_3.keybuf_.off._7_1_ = 0;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_ad0,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa00);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__9.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_ad0,
             (art_key_type)
             gtest_ar__9.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_3.keybuf_.off + 7),false);
  local_ae9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_ad0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ae8,&local_ae9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_ae8,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1bf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b00,&local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b30,(bool *)((long)&it_3.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_b30,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_b40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1c0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b40,&local_b38);
    testing::internal::AssertHelper::~AssertHelper(&local_b40);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  local_b88 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_ad0);
  akey_02._M_extent = local_b88._M_extent._M_extent_value;
  akey_02._M_ptr = (pointer)akey_02._M_extent._M_extent_value;
  local_b78 = decode((anon_unknown_dwarf_d5c8 *)local_b88._M_ptr,akey_02);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_b70,"(decode(it.get_key()))","(k0)",&local_b78,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1c1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  local_bc0 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_ad0);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_ba9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_bc0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ba8,&local_ba9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bf8,(internal *)local_ba8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_bf8);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1c3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_bd8,local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)local_bf8);
    testing::Message::~Message(local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_ad0);
  it_4.keybuf_.off._7_1_ = 0;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_d70,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__12.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_d70,
             (art_key_type)
             gtest_ar__12.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_4.keybuf_.off + 7),false);
  local_d89 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_d70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d88,&local_d89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
  if (!bVar1) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_d88,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__13.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1ca,pcVar4);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd0,(bool *)((long)&it_4.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar1) {
    testing::Message::Message(&local_dd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_dd0,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_de0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1cb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_de0,&local_dd8);
    testing::internal::AssertHelper::~AssertHelper(&local_de0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  local_e28 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)local_d70);
  akey_03._M_extent = local_e28._M_extent._M_extent_value;
  akey_03._M_ptr = (pointer)akey_03._M_extent._M_extent_value;
  local_e18 = decode((anon_unknown_dwarf_d5c8 *)local_e28._M_ptr,akey_03);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e10,"(decode(it.get_key()))","(k1)",&local_e18,&k2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e10);
  if (!bVar1) {
    testing::Message::Message(&local_e30);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1cc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14.message_,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e10);
  local_e60 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)local_d70);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_e49 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_e60,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e48,&local_e49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(local_e70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e98,(internal *)local_e48,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e98);
    testing::internal::AssertHelper::AssertHelper
              (&local_e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1ce,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e78,local_e70);
    testing::internal::AssertHelper::~AssertHelper(&local_e78);
    std::__cxx11::string::~string((string *)local_e98);
    testing::Message::~Message(local_e70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_d70);
  it_5.keybuf_.off._7_1_ = 0;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_1010,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xab10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__15.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_1010,
             (art_key_type)
             gtest_ar__15.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_5.keybuf_.off + 7),false);
  local_1029 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_1010);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1028,&local_1029,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1028);
  if (!bVar1) {
    testing::Message::Message(&local_1038);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_1028,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__16.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1d5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1040,&local_1038);
    testing::internal::AssertHelper::~AssertHelper(&local_1040);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_1038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1028);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1070,(bool *)((long)&it_5.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1070);
  if (!bVar1) {
    testing::Message::Message(&local_1078);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_1070,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1d6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1080,&local_1078);
    testing::internal::AssertHelper::~AssertHelper(&local_1080);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1070);
  local_10c8 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key((iterator *)local_1010);
  akey_04._M_extent = local_10c8._M_extent._M_extent_value;
  akey_04._M_ptr = (pointer)akey_04._M_extent._M_extent_value;
  local_10b8 = decode((anon_unknown_dwarf_d5c8 *)local_10c8._M_ptr,akey_04);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_10b0,"(decode(it.get_key()))","(k2)",&local_10b8,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(&local_10d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1d7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_10d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_10d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  local_1100 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_val((iterator *)local_1010);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_10e9 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1100,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10e8,&local_10e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar1) {
    testing::Message::Message(local_1110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1138,(internal *)local_10e8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1138);
    testing::internal::AssertHelper::AssertHelper
              (&local_1118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1d9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1118,local_1110);
    testing::internal::AssertHelper::~AssertHelper(&local_1118);
    std::__cxx11::string::~string((string *)local_1138);
    testing::Message::~Message(local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_1010);
  it_6.keybuf_.off._7_1_ = 1;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_12b0,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__18.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_12b0,
             (art_key_type)
             gtest_ar__18.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_6.keybuf_.off + 7),true);
  local_12c9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_12b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12c8,&local_12c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c8);
  if (!bVar1) {
    testing::Message::Message(&local_12d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_12c8,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_12e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1e4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_12e0,&local_12d8);
    testing::internal::AssertHelper::~AssertHelper(&local_12e0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_12d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
  local_1311 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1310,"(match)","(false)",(bool *)((long)&it_6.keybuf_.off + 7),
             &local_1311);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1310);
  if (!bVar1) {
    testing::Message::Message(&local_1320);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1e5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1310);
  local_1350 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key((iterator *)local_12b0);
  akey_05._M_extent = local_1350._M_extent._M_extent_value;
  akey_05._M_ptr = (pointer)akey_05._M_extent._M_extent_value;
  local_1340 = decode((anon_unknown_dwarf_d5c8 *)local_1350._M_ptr,akey_05);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1338,"(decode(it.get_key()))","(k0)",&local_1340,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1338);
  if (!bVar1) {
    testing::Message::Message(&local_1358);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1e6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_1358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1338);
  local_1388 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_val((iterator *)local_12b0);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_1371 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1388,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1370,&local_1371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1370);
  if (!bVar1) {
    testing::Message::Message(local_1398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_13c0,(internal *)local_1370,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_13c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_13a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1e8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_13a0,local_1398);
    testing::internal::AssertHelper::~AssertHelper(&local_13a0);
    std::__cxx11::string::~string((string *)local_13c0);
    testing::Message::~Message(local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1370);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_12b0);
  it_7.keybuf_.off._7_1_ = 1;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_1538,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0xffff);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__20.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_1538,
             (art_key_type)
             gtest_ar__20.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_7.keybuf_.off + 7),true);
  local_1551 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_1538);
  local_1551 = !local_1551;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1550,&local_1551,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1550);
  if (!bVar1) {
    testing::Message::Message(&local_1560);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_1550,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__21.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1f0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1568,&local_1560);
    testing::internal::AssertHelper::~AssertHelper(&local_1568);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_1560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1550);
  local_1599 = (bool)(~it_7.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1598,&local_1599,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1598);
  if (!bVar1) {
    testing::Message::Message(&local_15a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_15d0,(internal *)local_1598,(AssertionResult *)0x30452b,"true",
               "false",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_15d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_15b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1f1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_15b0,&local_15a8);
    testing::internal::AssertHelper::~AssertHelper(&local_15b0);
    std::__cxx11::string::~string((string *)local_15d0);
    testing::Message::~Message(&local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1598);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_1538);
  it_8.keybuf_.off._7_1_ = 1;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_1748,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__22.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_1748,
             (art_key_type)
             gtest_ar__22.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_8.keybuf_.off + 7),false);
  local_1761 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_1748);
  local_1761 = !local_1761;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1760,&local_1761,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
  if (!bVar1) {
    testing::Message::Message(&local_1770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_1760,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__23.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1f9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1778,&local_1770);
    testing::internal::AssertHelper::~AssertHelper(&local_1778);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
  local_17a9 = (bool)(~it_8.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17a8,&local_17a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17a8);
  if (!bVar1) {
    testing::Message::Message(&local_17b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_17e0,(internal *)local_17a8,(AssertionResult *)0x30452b,"true",
               "false",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_17e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_17c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x1fa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_17c0,&local_17b8);
    testing::internal::AssertHelper::~AssertHelper(&local_17c0);
    std::__cxx11::string::~string((string *)local_17e0);
    testing::Message::~Message(&local_17b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17a8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_1748);
  it_9.keybuf_.off._7_1_ = 1;
  unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator((iterator *)local_1958,
                     (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                     )k0);
  kVar3 = unodb::test::
          tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0xffff);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__24.message_,kVar3);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_1958,
             (art_key_type)
             gtest_ar__24.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(bool *)((long)&it_9.keybuf_.off + 7),false);
  local_1971 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_1958);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1970,&local_1971,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1970);
  if (!bVar1) {
    testing::Message::Message(&local_1980);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_1970,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__25.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x202,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1988,&local_1980);
    testing::internal::AssertHelper::~AssertHelper(&local_1988);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1980);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1970);
  local_19b9 = (bool)(~it_9.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19b8,&local_19b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19b8);
  if (!bVar1) {
    testing::Message::Message(&local_19c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_19b8,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_19d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x203,pcVar4);
    testing::internal::AssertHelper::operator=(&local_19d0,&local_19c8);
    testing::internal::AssertHelper::~AssertHelper(&local_19d0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_19c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19b8);
  local_1a18 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key((iterator *)local_1958);
  akey_06._M_extent = local_1a18._M_extent._M_extent_value;
  akey_06._M_ptr = (pointer)akey_06._M_extent._M_extent_value;
  local_1a08 = decode((anon_unknown_dwarf_d5c8 *)local_1a18._M_ptr,akey_06);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a00,"(decode(it.get_key()))","(k2)",&local_1a08,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a00);
  if (!bVar1) {
    testing::Message::Message(&local_1a20);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x204,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__26.message_,&local_1a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_1a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a00);
  local_1a50 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_val((iterator *)local_1958);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_1a39 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1a50,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a38,&local_1a39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a38);
  if (!bVar1) {
    testing::Message::Message(local_1a60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_1a38,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__27.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x206,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a68,local_1a60);
    testing::internal::AssertHelper::~AssertHelper(&local_1a68);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(local_1a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a38);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)local_1958);
  local_1a99 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid((iterator *)local_1958);
  local_1a99 = !local_1a99;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a98,&local_1a99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a98);
  if (!bVar1) {
    testing::Message::Message(&local_1aa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1ad0,(internal *)local_1a98,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1ad0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1ab0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x208,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1ab0,&local_1aa8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ab0);
    std::__cxx11::string::~string((string *)&local_1ad0);
    testing::Message::~Message(&local_1aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a98);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_1958);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, C101) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  constexpr std::uint64_t k0 = 0xaa00;
  constexpr std::uint64_t k1 = 0xaa10;
  constexpr std::uint64_t k2 = 0xab10;
  verifier.insert(k0, unodb::test::test_values[0]);
  verifier.insert(k1, unodb::test::test_values[1]);
  verifier.insert(k2, unodb::test::test_values[2]);
  {    // exact match, forward traversal
    {  // exact match, forward traversal (GTE), first key.
      auto it = db.test_only_iterator();
      bool match = false;
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, forward traversal (GTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, forward traversal (GTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // exact match, reverse traversal
    {  // exact match, reverse traversal (LTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, reverse traversal (LTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, reverse traversal (LTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // before and after the first and last key
    {  // forward traversal, before the first key in the data.
      // match=false and iterator is positioned on the first key in the
      // data.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_EQ(match, false);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // forward traversal, after the last key in the data.  match=false
      // and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, true /*fwd*/);
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {  // reverse traversal, before the first key in the data.
      // match=false and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {  // reverse traversal, after the last key in the data.  match=false
      // and iterator is positioned at the last key.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_FALSE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
      it.next();
      UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
    }
  }
}